

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

HighsInt dataSize(HighsIndexCollection *index_collection)

{
  HighsIndexCollection *index_collection_local;
  int local_4;
  
  if ((index_collection->is_set_ & 1U) == 0) {
    if ((index_collection->is_interval_ & 1U) == 0) {
      local_4 = index_collection->dimension_;
    }
    else {
      local_4 = (index_collection->to_ - index_collection->from_) + 1;
    }
  }
  else {
    local_4 = index_collection->set_num_entries_;
  }
  return local_4;
}

Assistant:

HighsInt dataSize(const HighsIndexCollection& index_collection) {
  if (index_collection.is_set_) {
    return index_collection.set_num_entries_;
  } else {
    if (index_collection.is_interval_) {
      return index_collection.to_ - index_collection.from_ + 1;
    } else {
      return index_collection.dimension_;
    }
  }
}